

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale,bool shadow)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImU32 IVar7;
  ImGuiContext *g;
  ImGuiContext *pIVar8;
  undefined7 in_register_00000039;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar8 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  fVar11 = pIVar8->FontSize * 0.4 * scale;
  fVar12 = pIVar8->FontSize * 0.5;
  fVar13 = fVar12 + p_min.x;
  fVar12 = scale * fVar12 + p_min.y;
  if ((int)CONCAT71(in_register_00000039,is_open) == 0) {
    fVar14 = fVar11 * 0.0 + fVar12;
    fVar9 = fVar11 * -0.5 + fVar13;
    fVar10 = fVar12 + fVar11 * 0.866;
    fVar12 = fVar12 - fVar11 * 0.866;
    fVar15 = fVar9;
  }
  else {
    fVar12 = fVar11 * -0.25 + fVar12;
    fVar14 = fVar11 + fVar12;
    fVar9 = fVar13 - fVar11 * 0.866;
    fVar10 = fVar12 - fVar11 * 0.5;
    fVar15 = fVar11 * 0.866 + fVar13;
    fVar12 = fVar10;
    fVar11 = fVar11 * 0.0;
  }
  local_60.y = fVar14;
  local_60.x = fVar11 + fVar13;
  local_68.y = fVar10;
  local_68.x = fVar9;
  local_70.y = fVar12;
  local_70.x = fVar15;
  if ((shadow) && ((pIVar1->Flags & 0x80) != 0)) {
    pIVar2 = pIVar1->DrawList;
    local_30.y = fVar14 + 2.0;
    local_30.x = fVar11 + fVar13 + 2.0;
    local_38.y = fVar10 + 2.0;
    local_38.x = fVar9 + 2.0;
    local_40.y = fVar12 + 2.0;
    local_40.x = fVar15 + 2.0;
    local_58.x = (pIVar8->Style).Colors[6].x;
    local_58.y = (pIVar8->Style).Colors[6].y;
    uVar3 = (pIVar8->Style).Colors[6].z;
    uVar4 = (pIVar8->Style).Colors[6].w;
    local_58.w = (pIVar8->Style).Alpha * (float)uVar4;
    local_58.z = (float)uVar3;
    IVar7 = ColorConvertFloat4ToU32(&local_58);
    ImDrawList::AddTriangleFilled(pIVar2,&local_30,&local_38,&local_40,IVar7);
    pIVar8 = GImGui;
  }
  pIVar2 = pIVar1->DrawList;
  local_58.x = (pIVar8->Style).Colors[0].x;
  local_58.y = (pIVar8->Style).Colors[0].y;
  uVar5 = (pIVar8->Style).Colors[0].z;
  uVar6 = (pIVar8->Style).Colors[0].w;
  local_58.w = (pIVar8->Style).Alpha * (float)uVar6;
  local_58.z = (float)uVar5;
  IVar7 = ColorConvertFloat4ToU32(&local_58);
  ImDrawList::AddTriangleFilled(pIVar2,&local_60,&local_68,&local_70,IVar7);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale, bool shadow)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    if (shadow && (window->Flags & ImGuiWindowFlags_ShowBorders) != 0)
        window->DrawList->AddTriangleFilled(a+ImVec2(2,2), b+ImVec2(2,2), c+ImVec2(2,2), GetColorU32(ImGuiCol_BorderShadow));
    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}